

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O1

void __thiscall cmSourceFile::SetProperty(cmSourceFile *this,string *prop,char *value)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  
  cmPropertyMap::SetProperty(&this->Properties,prop,value);
  __n = prop->_M_string_length;
  if (__n == propGENERATED_abi_cxx11_._M_string_length) {
    if ((__n != 0) &&
       (iVar2 = bcmp((prop->_M_dataplus)._M_p,propGENERATED_abi_cxx11_._M_dataplus._M_p,__n),
       iVar2 != 0)) {
      return;
    }
    bVar1 = cmSystemTools::IsOn(value);
    this->IsGenerated = bVar1;
  }
  return;
}

Assistant:

void cmSourceFile::SetProperty(const std::string& prop, const char* value)
{
  this->Properties.SetProperty(prop, value);

  // Update IsGenerated flag
  if (prop == propGENERATED) {
    this->IsGenerated = cmSystemTools::IsOn(value);
  }
}